

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int luv_new_udp(lua_State *L)

{
  int iVar1;
  uv_udp_t *handle;
  uv_loop_t *loop;
  lua_Integer lVar2;
  luv_handle_t *plVar3;
  int iVar4;
  
  handle = (uv_udp_t *)luv_newuserdata(L,0xd8);
  iVar4 = 1;
  iVar1 = lua_type(L,1);
  loop = luv_loop(L);
  if (iVar1 < 1) {
    iVar1 = uv_udp_init(loop,handle);
  }
  else {
    lVar2 = lua_tointegerx(L,1,(int *)0x0);
    iVar1 = uv_udp_init_ex(loop,handle,(uint)lVar2);
  }
  if (iVar1 < 0) {
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar4 = 3;
  }
  else {
    plVar3 = luv_setup_handle(L);
    handle->data = plVar3;
  }
  return iVar4;
}

Assistant:

static int luv_new_udp(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  lua_settop(L, 1);
  uv_udp_t* handle = (uv_udp_t*)luv_newuserdata(L, sizeof(*handle));
  int ret;
  if (lua_isnoneornil(L, 1)) {
    ret = uv_udp_init(ctx->loop, handle);
  }
  else {
    unsigned int flags = AF_UNSPEC;
    if (lua_isnumber(L, 1)) {
      flags = lua_tointeger(L, 1);
    }
    else if (lua_isstring(L, 1)) {
      const char* family = lua_tostring(L, 1);
      flags = luv_af_string_to_num(family);
      if (!flags) {
        luaL_argerror(L, 1, lua_pushfstring(L, "invalid or unknown address family: '%s'", family));
      }
    }
    else {
      luaL_argerror(L, 1, "expected string or integer");
    }
    ret = uv_udp_init_ex(ctx->loop, handle, flags);
  }
  if (ret < 0) {
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  handle->data = luv_setup_handle(L, ctx);
  return 1;
}